

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::isBitstreamCastable(Type *this,Type *rhs)

{
  bool bVar1;
  Type *this_00;
  Type *this_01;
  uint64_t uVar2;
  uint64_t uVar3;
  
  this_00 = getCanonicalType(this);
  this_01 = getCanonicalType(rhs);
  bVar1 = isBitstreamType(this_00,true);
  if ((!bVar1) || (bVar1 = isBitstreamType(this_01,false), !bVar1)) {
    return false;
  }
  bVar1 = isFixedSize(this_00);
  if ((bVar1) && (bVar1 = isFixedSize(this_01), bVar1)) {
    uVar2 = getBitstreamWidth(this_00);
    uVar3 = getBitstreamWidth(this_01);
    return uVar2 == uVar3;
  }
  bVar1 = Bitstream::dynamicSizesMatch<slang::ast::Type,slang::ast::Type>(this_00,this_01);
  return bVar1;
}

Assistant:

bool Type::isBitstreamCastable(const Type& rhs) const {
    const Type* l = &getCanonicalType();
    const Type* r = &rhs.getCanonicalType();
    if (l->isBitstreamType(true) && r->isBitstreamType()) {
        if (l->isFixedSize() && r->isFixedSize())
            return l->getBitstreamWidth() == r->getBitstreamWidth();
        else
            return Bitstream::dynamicSizesMatch(*l, *r);
    }
    return false;
}